

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O2

bool FIX::TimeRange::isInSameRange(DateTime *start,DateTime *end,DateTime *time1,DateTime *time2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  bVar1 = isInRange(start,end,time1);
  if ((!bVar1) || (bVar1 = isInRange(start,end,time2), !bVar1)) {
    return false;
  }
  if ((time1->m_date == time2->m_date) && (time1->m_time == time2->m_time)) {
    return true;
  }
  bVar1 = operator<(start,end);
  if ((!bVar1) && ((start->m_date != end->m_date || (start->m_time != end->m_time)))) {
    iVar2 = operator-(start,end);
    bVar1 = operator>(time1,time2);
    if (bVar1) {
      iVar3 = (int)(start->m_time / -1000000000) +
              (int)(time2->m_time / 1000000000) + start->m_date * -0x15180;
      lVar4 = (long)iVar3 + 0x15180;
      if (-1 < iVar3) {
        lVar4 = (long)iVar3;
      }
      iVar3 = operator-(time1,time2);
      return (long)iVar3 < (0x15180 - iVar2) - lVar4;
    }
    iVar3 = operator-(time2,time1);
    return iVar3 < 0x15180 - iVar2;
  }
  return time1->m_date == time2->m_date;
}

Assistant:

bool TimeRange::isInSameRange(
    const DateTime &start,
    const DateTime &end,
    const DateTime &time1,
    const DateTime &time2) {
  if (!isInRange(start, end, time1)) {
    return false;
  }
  if (!isInRange(start, end, time2)) {
    return false;
  }

  if (time1 == time2) {
    return true;
  }

  if (start < end || start == end) {
    UtcDate time1Date(time1);
    UtcDate time2Date(time2);

    return time1Date == time2Date;
  } else {
    int sessionLength = DateTime::SECONDS_PER_DAY - (start - end);

    if (time1 > time2) {
      UtcTimeOnly time2TimeOnly = UtcTimeOnly(time2);

      long delta = time2TimeOnly - start;
      if (delta < 0) {
        delta = DateTime::SECONDS_PER_DAY - labs(delta);
      }

      return (time1 - time2) < (sessionLength - delta);
    } else {
      return (time2 - time1) < sessionLength;
    }
  }
}